

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionAnalyzer.cpp
# Opt level: O0

bool __thiscall
wasm::ExpressionAnalyzer::flexibleEqual(wasm::Expression*,wasm::Expression*,std::function<bool(wasm
::Expression*,wasm::Expression*)>)::Comparer::compareNodes(wasm::Expression*,wasm::Expression__
          (void *this,Expression *left,Expression *right)

{
  value_type_conflict1 vVar1;
  string_view sVar2;
  bool bVar3;
  bool bVar4;
  Block *pBVar5;
  Block *pBVar6;
  If *pIVar7;
  If *pIVar8;
  Loop *pLVar9;
  Loop *pLVar10;
  Break *pBVar11;
  Break *pBVar12;
  Switch *pSVar13;
  Switch *pSVar14;
  Call *pCVar15;
  Call *pCVar16;
  CallIndirect *pCVar17;
  CallIndirect *pCVar18;
  LocalGet *pLVar19;
  LocalGet *pLVar20;
  LocalSet *pLVar21;
  LocalSet *pLVar22;
  GlobalGet *pGVar23;
  GlobalGet *pGVar24;
  GlobalSet *pGVar25;
  GlobalSet *pGVar26;
  Load *pLVar27;
  Load *pLVar28;
  Store *pSVar29;
  Store *pSVar30;
  AtomicRMW *pAVar31;
  AtomicRMW *pAVar32;
  AtomicCmpxchg *pAVar33;
  AtomicCmpxchg *pAVar34;
  AtomicWait *pAVar35;
  AtomicWait *pAVar36;
  AtomicNotify *pAVar37;
  AtomicNotify *pAVar38;
  AtomicFence *pAVar39;
  AtomicFence *pAVar40;
  SIMDExtract *pSVar41;
  SIMDExtract *pSVar42;
  SIMDReplace *pSVar43;
  SIMDReplace *pSVar44;
  SIMDShuffle *pSVar45;
  SIMDShuffle *pSVar46;
  size_type sVar47;
  size_type sVar48;
  reference pvVar49;
  SIMDTernary *pSVar50;
  SIMDTernary *pSVar51;
  SIMDShift *pSVar52;
  SIMDShift *pSVar53;
  SIMDLoad *pSVar54;
  SIMDLoad *pSVar55;
  SIMDLoadStoreLane *pSVar56;
  SIMDLoadStoreLane *pSVar57;
  address64_t aVar58;
  address64_t aVar59;
  MemoryInit *pMVar60;
  MemoryInit *pMVar61;
  DataDrop *pDVar62;
  DataDrop *pDVar63;
  MemoryCopy *pMVar64;
  MemoryCopy *pMVar65;
  MemoryFill *pMVar66;
  MemoryFill *pMVar67;
  Const *pCVar68;
  Const *pCVar69;
  Unary *pUVar70;
  Unary *pUVar71;
  Binary *pBVar72;
  Binary *pBVar73;
  Select *pSVar74;
  Select *pSVar75;
  Drop *pDVar76;
  Drop *pDVar77;
  Return *pRVar78;
  Return *pRVar79;
  MemorySize *pMVar80;
  MemorySize *pMVar81;
  MemoryGrow *pMVar82;
  MemoryGrow *pMVar83;
  RefIsNull *pRVar84;
  RefIsNull *pRVar85;
  RefFunc *pRVar86;
  RefFunc *pRVar87;
  RefEq *pRVar88;
  RefEq *pRVar89;
  TableGet *pTVar90;
  TableGet *pTVar91;
  TableSet *pTVar92;
  TableSet *pTVar93;
  TableSize *pTVar94;
  TableSize *pTVar95;
  TableGrow *pTVar96;
  TableGrow *pTVar97;
  TableFill *pTVar98;
  TableFill *pTVar99;
  TableCopy *pTVar100;
  TableCopy *pTVar101;
  TableInit *pTVar102;
  TableInit *pTVar103;
  Try *pTVar104;
  Try *pTVar105;
  mapped_type *pmVar106;
  TryTable *pTVar107;
  TryTable *pTVar108;
  bool *pbVar109;
  Throw *pTVar110;
  Throw *pTVar111;
  Rethrow *pRVar112;
  Rethrow *pRVar113;
  ThrowRef *pTVar114;
  ThrowRef *pTVar115;
  TupleMake *pTVar116;
  TupleMake *pTVar117;
  TupleExtract *pTVar118;
  TupleExtract *pTVar119;
  RefI31 *pRVar120;
  RefI31 *pRVar121;
  I31Get *pIVar122;
  I31Get *pIVar123;
  CallRef *pCVar124;
  CallRef *pCVar125;
  RefTest *pRVar126;
  RefTest *pRVar127;
  RefCast *pRVar128;
  RefCast *pRVar129;
  BrOn *pBVar130;
  BrOn *pBVar131;
  StructNew *pSVar132;
  StructNew *pSVar133;
  StructGet *pSVar134;
  StructGet *pSVar135;
  StructSet *pSVar136;
  StructSet *pSVar137;
  StructRMW *pSVar138;
  StructRMW *pSVar139;
  StructCmpxchg *pSVar140;
  StructCmpxchg *pSVar141;
  ArrayNew *pAVar142;
  ArrayNew *pAVar143;
  ArrayNewData *pAVar144;
  ArrayNewData *pAVar145;
  ArrayNewElem *pAVar146;
  ArrayNewElem *pAVar147;
  ArrayNewFixed *pAVar148;
  ArrayNewFixed *pAVar149;
  ArrayGet *pAVar150;
  ArrayGet *pAVar151;
  ArraySet *pAVar152;
  ArraySet *pAVar153;
  ArrayLen *pAVar154;
  ArrayLen *pAVar155;
  ArrayCopy *pAVar156;
  ArrayCopy *pAVar157;
  ArrayFill *pAVar158;
  ArrayFill *pAVar159;
  ArrayInitData *pAVar160;
  ArrayInitData *pAVar161;
  ArrayInitElem *pAVar162;
  ArrayInitElem *pAVar163;
  RefAs *pRVar164;
  RefAs *pRVar165;
  StringNew *pSVar166;
  StringNew *pSVar167;
  StringConst *pSVar168;
  StringConst *pSVar169;
  StringMeasure *pSVar170;
  StringMeasure *pSVar171;
  StringEncode *pSVar172;
  StringEncode *pSVar173;
  StringConcat *pSVar174;
  StringConcat *pSVar175;
  StringEq *pSVar176;
  StringEq *pSVar177;
  StringWTF16Get *pSVar178;
  StringWTF16Get *pSVar179;
  StringSliceWTF *pSVar180;
  StringSliceWTF *pSVar181;
  ContNew *pCVar182;
  ContNew *pCVar183;
  ContBind *pCVar184;
  ContBind *pCVar185;
  Suspend *pSVar186;
  Suspend *pSVar187;
  Resume *pRVar188;
  Resume *pRVar189;
  ResumeThrow *pRVar190;
  ResumeThrow *pRVar191;
  Type *pTVar192;
  Type *pTVar193;
  Name *pNVar194;
  IString *pIVar195;
  IString *pIVar196;
  StackSwitch *pSVar197;
  StackSwitch *pSVar198;
  size_t sVar199;
  size_t sVar200;
  Expression **ppEVar201;
  Expression *local_cd8;
  Expression *child_27;
  Iterator __end4_27;
  Iterator __begin4_27;
  ExpressionList *__range4_27;
  Expression *child_26;
  Iterator __end4_26;
  Iterator __begin4_26;
  ExpressionList *__range4_26;
  StackSwitch *castRight_94;
  StackSwitch *castLeft_94;
  Index i_12;
  uint local_c3c;
  Expression *pEStack_c38;
  Index i_11;
  Expression *child_25;
  Iterator __end4_25;
  Iterator __begin4_25;
  ExpressionList *__range4_25;
  Expression *child_24;
  Iterator __end4_24;
  Iterator __begin4_24;
  ExpressionList *__range4_24;
  Index i_10;
  ResumeThrow *castRight_93;
  ResumeThrow *castLeft_93;
  Index i_9;
  uint local_b94;
  Expression *pEStack_b90;
  Index i_8;
  Expression *child_23;
  Iterator __end4_23;
  Iterator __begin4_23;
  ExpressionList *__range4_23;
  Expression *child_22;
  Iterator __end4_22;
  Iterator __begin4_22;
  ExpressionList *__range4_22;
  Index i_7;
  Resume *castRight_92;
  Resume *castLeft_92;
  Expression *child_21;
  Iterator __end4_21;
  Iterator __begin4_21;
  ExpressionList *__range4_21;
  Expression *child_20;
  Iterator __end4_20;
  Iterator __begin4_20;
  ExpressionList *__range4_20;
  Suspend *castRight_91;
  Suspend *castLeft_91;
  Expression *child_19;
  Iterator __end4_19;
  Iterator __begin4_19;
  ExpressionList *__range4_19;
  Expression *child_18;
  Iterator __end4_18;
  Iterator __begin4_18;
  ExpressionList *__range4_18;
  ContBind *castRight_90;
  ContBind *castLeft_90;
  ContNew *castRight_89;
  ContNew *castLeft_89;
  StringSliceWTF *castRight_88;
  StringSliceWTF *castLeft_88;
  StringWTF16Get *castRight_87;
  StringWTF16Get *castLeft_87;
  StringEq *castRight_86;
  StringEq *castLeft_86;
  StringConcat *castRight_85;
  StringConcat *castLeft_85;
  StringEncode *castRight_84;
  StringEncode *castLeft_84;
  StringMeasure *castRight_83;
  StringMeasure *castLeft_83;
  StringConst *castRight_82;
  StringConst *castLeft_82;
  StringNew *castRight_81;
  StringNew *castLeft_81;
  RefAs *castRight_80;
  RefAs *castLeft_80;
  ArrayInitElem *castRight_79;
  ArrayInitElem *castLeft_79;
  ArrayInitData *castRight_78;
  ArrayInitData *castLeft_78;
  ArrayFill *castRight_77;
  ArrayFill *castLeft_77;
  ArrayCopy *castRight_76;
  ArrayCopy *castLeft_76;
  ArrayLen *castRight_75;
  ArrayLen *castLeft_75;
  ArraySet *castRight_74;
  ArraySet *castLeft_74;
  ArrayGet *castRight_73;
  ArrayGet *castLeft_73;
  Expression *child_17;
  Iterator __end4_17;
  Iterator __begin4_17;
  ExpressionList *__range4_17;
  Expression *child_16;
  Iterator __end4_16;
  Iterator __begin4_16;
  ExpressionList *__range4_16;
  ArrayNewFixed *castRight_72;
  ArrayNewFixed *castLeft_72;
  ArrayNewElem *castRight_71;
  ArrayNewElem *castLeft_71;
  ArrayNewData *castRight_70;
  ArrayNewData *castLeft_70;
  ArrayNew *castRight_69;
  ArrayNew *castLeft_69;
  StructCmpxchg *castRight_68;
  StructCmpxchg *castLeft_68;
  StructRMW *castRight_67;
  StructRMW *castLeft_67;
  StructSet *castRight_66;
  StructSet *castLeft_66;
  StructGet *castRight_65;
  StructGet *castLeft_65;
  Expression *child_15;
  Iterator __end4_15;
  Iterator __begin4_15;
  ExpressionList *__range4_15;
  Expression *child_14;
  Iterator __end4_14;
  Iterator __begin4_14;
  ExpressionList *__range4_14;
  StructNew *castRight_64;
  StructNew *castLeft_64;
  BrOn *castRight_63;
  BrOn *castLeft_63;
  RefCast *castRight_62;
  RefCast *castLeft_62;
  RefTest *castRight_61;
  RefTest *castLeft_61;
  Expression *child_13;
  Iterator __end4_13;
  Iterator __begin4_13;
  ExpressionList *__range4_13;
  Expression *child_12;
  Iterator __end4_12;
  Iterator __begin4_12;
  ExpressionList *__range4_12;
  CallRef *castRight_60;
  CallRef *castLeft_60;
  I31Get *castRight_59;
  I31Get *castLeft_59;
  RefI31 *castRight_58;
  RefI31 *castLeft_58;
  TupleExtract *castRight_57;
  TupleExtract *castLeft_57;
  Expression *child_11;
  Iterator __end4_11;
  Iterator __begin4_11;
  ExpressionList *__range4_11;
  Expression *child_10;
  Iterator __end4_10;
  Iterator __begin4_10;
  ExpressionList *__range4_10;
  TupleMake *castRight_56;
  TupleMake *castLeft_56;
  Pop *castRight_55;
  Pop *castLeft_55;
  Unreachable *castRight_54;
  Unreachable *castLeft_54;
  Nop *castRight_53;
  Nop *castLeft_53;
  ThrowRef *castRight_52;
  ThrowRef *castLeft_52;
  Rethrow *castRight_51;
  Rethrow *castLeft_51;
  Expression *child_9;
  Iterator __end4_9;
  Iterator __begin4_9;
  ExpressionList *__range4_9;
  Expression *child_8;
  Iterator __end4_8;
  Iterator __begin4_8;
  ExpressionList *__range4_8;
  Throw *castRight_50;
  Throw *castLeft_50;
  Index i_6;
  uint local_56c;
  uint local_568;
  Index i_5;
  Index i_4;
  Index i_3;
  TryTable *castRight_49;
  TryTable *castLeft_49;
  Expression *pEStack_548;
  Index i_2;
  Expression *child_7;
  Iterator __end4_7;
  Iterator __begin4_7;
  ExpressionList *__range4_7;
  Expression *child_6;
  Iterator __end4_6;
  Iterator __begin4_6;
  ExpressionList *__range4_6;
  Try *castRight_48;
  Try *castLeft_48;
  TableInit *castRight_47;
  TableInit *castLeft_47;
  TableCopy *castRight_46;
  TableCopy *castLeft_46;
  TableFill *castRight_45;
  TableFill *castLeft_45;
  TableGrow *castRight_44;
  TableGrow *castLeft_44;
  TableSize *castRight_43;
  TableSize *castLeft_43;
  TableSet *castRight_42;
  TableSet *castLeft_42;
  TableGet *castRight_41;
  TableGet *castLeft_41;
  RefEq *castRight_40;
  RefEq *castLeft_40;
  RefFunc *castRight_39;
  RefFunc *castLeft_39;
  RefIsNull *castRight_38;
  RefIsNull *castLeft_38;
  RefNull *castRight_37;
  RefNull *castLeft_37;
  MemoryGrow *castRight_36;
  MemoryGrow *castLeft_36;
  MemorySize *castRight_35;
  MemorySize *castLeft_35;
  Return *castRight_34;
  Return *castLeft_34;
  Drop *castRight_33;
  Drop *castLeft_33;
  Select *castRight_32;
  Select *castLeft_32;
  Binary *castRight_31;
  Binary *castLeft_31;
  Unary *castRight_30;
  Unary *castLeft_30;
  Const *castRight_29;
  Const *castLeft_29;
  MemoryFill *castRight_28;
  MemoryFill *castLeft_28;
  MemoryCopy *castRight_27;
  MemoryCopy *castLeft_27;
  DataDrop *castRight_26;
  DataDrop *castLeft_26;
  MemoryInit *castRight_25;
  MemoryInit *castLeft_25;
  SIMDLoadStoreLane *castRight_24;
  SIMDLoadStoreLane *castLeft_24;
  SIMDLoad *castRight_23;
  SIMDLoad *castLeft_23;
  SIMDShift *castRight_22;
  SIMDShift *castLeft_22;
  SIMDTernary *castRight_21;
  SIMDTernary *castLeft_21;
  Index i_1;
  SIMDShuffle *castRight_20;
  SIMDShuffle *castLeft_20;
  SIMDReplace *castRight_19;
  SIMDReplace *castLeft_19;
  SIMDExtract *castRight_18;
  SIMDExtract *castLeft_18;
  AtomicFence *castRight_17;
  AtomicFence *castLeft_17;
  AtomicNotify *castRight_16;
  AtomicNotify *castLeft_16;
  AtomicWait *castRight_15;
  AtomicWait *castLeft_15;
  AtomicCmpxchg *castRight_14;
  AtomicCmpxchg *castLeft_14;
  AtomicRMW *castRight_13;
  AtomicRMW *castLeft_13;
  Store *castRight_12;
  Store *castLeft_12;
  Load *castRight_11;
  Load *castLeft_11;
  GlobalSet *castRight_10;
  GlobalSet *castLeft_10;
  GlobalGet *castRight_9;
  GlobalGet *castLeft_9;
  LocalSet *castRight_8;
  LocalSet *castLeft_8;
  LocalGet *castRight_7;
  LocalGet *castLeft_7;
  Expression *child_5;
  Iterator __end4_5;
  Iterator __begin4_5;
  ExpressionList *__range4_5;
  Expression *child_4;
  Iterator __end4_4;
  Iterator __begin4_4;
  ExpressionList *__range4_4;
  CallIndirect *castRight_6;
  CallIndirect *castLeft_6;
  Expression *child_3;
  Iterator __end4_3;
  Iterator __begin4_3;
  ExpressionList *__range4_3;
  Expression *child_2;
  Iterator __end4_2;
  Iterator __begin4_2;
  ExpressionList *__range4_2;
  Call *castRight_5;
  Call *castLeft_5;
  uint local_11c;
  Index i;
  Switch *castRight_4;
  Switch *castLeft_4;
  Break *castRight_3;
  Break *castLeft_3;
  Loop *castRight_2;
  Loop *castLeft_2;
  If *castRight_1;
  If *castLeft_1;
  Expression *child_1;
  Iterator __end4_1;
  Iterator __begin4_1;
  ExpressionList *__range4_1;
  Expression *child;
  Iterator __end4;
  Iterator __begin4;
  ExpressionList *__range4;
  Block *castRight;
  Block *castLeft;
  Expression *right_local;
  Expression *left_local;
  Comparer *this_local;
  
  if (left->_id != right->_id) {
    return false;
  }
  switch(left->_id) {
  case InvalidId:
  case NumExpressionIds:
    handle_unreachable("unexpected expression type",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-delegations-fields.def"
                       ,0x103);
  case BlockId:
    pBVar5 = Expression::cast<wasm::Block>(left);
    pBVar6 = Expression::cast<wasm::Block>(right);
    sVar199 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                        (&(pBVar5->list).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                        );
    sVar200 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                        (&(pBVar6->list).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                        );
    if (sVar199 != sVar200) {
      return false;
    }
    join_0x00000010_0x00000000_ =
         ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::begin
                   (&(pBVar5->list).
                     super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>);
    _child = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::end
                       (&(pBVar5->list).
                         super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>)
    ;
    while (bVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                   operator!=((Iterator *)&__end4.index,(Iterator *)&child), bVar4) {
      ppEVar201 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                  operator*((Iterator *)&__end4.index);
      __range4_1 = (ExpressionList *)*ppEVar201;
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                 ((long)this + 0x30),(value_type *)&__range4_1);
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::operator++
                ((Iterator *)&__end4.index);
    }
    join_0x00000010_0x00000000_ =
         ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::begin
                   (&(pBVar6->list).
                     super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>);
    _child_1 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::end
                         (&(pBVar6->list).
                           super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                         );
    while (bVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                   operator!=((Iterator *)&__end4_1.index,(Iterator *)&child_1), bVar4) {
      ppEVar201 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                  operator*((Iterator *)&__end4_1.index);
      castLeft_1 = (If *)*ppEVar201;
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                 ((long)this + 0x48),(value_type *)&castLeft_1);
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::operator++
                ((Iterator *)&__end4_1.index);
    }
    bVar4 = IString::is(&(pBVar5->name).super_IString);
    bVar3 = IString::is(&(pBVar6->name).super_IString);
    if (bVar4 != bVar3) {
      return false;
    }
    pmVar106 = std::
               map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
               ::operator[]((map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                             *)this,&pBVar5->name);
    wasm::Name::operator=(pmVar106,&pBVar6->name);
    break;
  case IfId:
    pIVar7 = Expression::cast<wasm::If>(left);
    pIVar8 = Expression::cast<wasm::If>(right);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pIVar7->ifFalse);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pIVar8->ifFalse);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pIVar7->ifTrue);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pIVar8->ifTrue);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pIVar7->condition);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pIVar8->condition);
    break;
  case LoopId:
    pLVar9 = Expression::cast<wasm::Loop>(left);
    pLVar10 = Expression::cast<wasm::Loop>(right);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pLVar9->body);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pLVar10->body);
    bVar4 = IString::is(&(pLVar9->name).super_IString);
    bVar3 = IString::is(&(pLVar10->name).super_IString);
    if (bVar4 != bVar3) {
      return false;
    }
    pmVar106 = std::
               map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
               ::operator[]((map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                             *)this,&pLVar9->name);
    wasm::Name::operator=(pmVar106,&pLVar10->name);
    break;
  case BreakId:
    pBVar11 = Expression::cast<wasm::Break>(left);
    pBVar12 = Expression::cast<wasm::Break>(right);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pBVar11->condition);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pBVar12->condition);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pBVar11->value);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pBVar12->value);
    bVar4 = compareNames(wasm::Name,wasm::Name_
                      (this,(Name)(pBVar11->name).super_IString.str,
                       (Name)(pBVar12->name).super_IString.str);
    if (!bVar4) {
      return false;
    }
    break;
  case SwitchId:
    pSVar13 = Expression::cast<wasm::Switch>(left);
    pSVar14 = Expression::cast<wasm::Switch>(right);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pSVar13->condition);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pSVar14->condition);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pSVar13->value);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pSVar14->value);
    bVar4 = compareNames(wasm::Name,wasm::Name_
                      (this,(Name)(pSVar13->default_).super_IString.str,
                       (Name)(pSVar14->default_).super_IString.str);
    if (!bVar4) {
      return false;
    }
    sVar199 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::size
                        (&(pSVar13->targets).
                          super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>);
    sVar200 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::size
                        (&(pSVar14->targets).
                          super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>);
    if (sVar199 != sVar200) {
      return false;
    }
    for (local_11c = 0;
        sVar199 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::size
                            (&(pSVar13->targets).
                              super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>),
        local_11c < sVar199; local_11c = local_11c + 1) {
      pNVar194 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::operator[]
                           (&(pSVar13->targets).
                             super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>,
                            (ulong)local_11c);
      sVar2 = (pNVar194->super_IString).str;
      pNVar194 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::operator[]
                           (&(pSVar14->targets).
                             super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>,
                            (ulong)local_11c);
      bVar4 = compareNames(wasm::Name,wasm::Name_
                        (this,(Name)sVar2,(Name)(pNVar194->super_IString).str);
      if (!bVar4) {
        return false;
      }
    }
    break;
  case CallId:
    pCVar15 = Expression::cast<wasm::Call>(left);
    pCVar16 = Expression::cast<wasm::Call>(right);
    sVar199 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                        (&(pCVar15->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                        );
    sVar200 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                        (&(pCVar16->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                        );
    if (sVar199 != sVar200) {
      return false;
    }
    join_0x00000010_0x00000000_ =
         ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::begin
                   (&(pCVar15->operands).
                     super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>);
    _child_2 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::end
                         (&(pCVar15->operands).
                           super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                         );
    while (bVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                   operator!=((Iterator *)&__end4_2.index,(Iterator *)&child_2), bVar4) {
      ppEVar201 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                  operator*((Iterator *)&__end4_2.index);
      __range4_3 = (ExpressionList *)*ppEVar201;
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                 ((long)this + 0x30),(value_type *)&__range4_3);
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::operator++
                ((Iterator *)&__end4_2.index);
    }
    join_0x00000010_0x00000000_ =
         ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::begin
                   (&(pCVar16->operands).
                     super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>);
    _child_3 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::end
                         (&(pCVar16->operands).
                           super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                         );
    while (bVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                   operator!=((Iterator *)&__end4_3.index,(Iterator *)&child_3), bVar4) {
      ppEVar201 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                  operator*((Iterator *)&__end4_3.index);
      castLeft_6 = (CallIndirect *)*ppEVar201;
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                 ((long)this + 0x48),(value_type *)&castLeft_6);
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::operator++
                ((Iterator *)&__end4_3.index);
    }
    bVar4 = IString::operator!=(&(pCVar15->target).super_IString,&(pCVar16->target).super_IString);
    if (bVar4) {
      return false;
    }
    if ((pCVar15->isReturn & 1U) != (pCVar16->isReturn & 1U)) {
      return false;
    }
    break;
  case CallIndirectId:
    pCVar17 = Expression::cast<wasm::CallIndirect>(left);
    pCVar18 = Expression::cast<wasm::CallIndirect>(right);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pCVar17->target);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pCVar18->target);
    bVar4 = IString::operator!=(&(pCVar17->table).super_IString,&(pCVar18->table).super_IString);
    if (bVar4) {
      return false;
    }
    sVar199 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                        (&(pCVar17->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                        );
    sVar200 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                        (&(pCVar18->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                        );
    if (sVar199 != sVar200) {
      return false;
    }
    join_0x00000010_0x00000000_ =
         ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::begin
                   (&(pCVar17->operands).
                     super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>);
    _child_4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::end
                         (&(pCVar17->operands).
                           super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                         );
    while (bVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                   operator!=((Iterator *)&__end4_4.index,(Iterator *)&child_4), bVar4) {
      ppEVar201 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                  operator*((Iterator *)&__end4_4.index);
      __range4_5 = (ExpressionList *)*ppEVar201;
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                 ((long)this + 0x30),(value_type *)&__range4_5);
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::operator++
                ((Iterator *)&__end4_4.index);
    }
    join_0x00000010_0x00000000_ =
         ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::begin
                   (&(pCVar18->operands).
                     super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>);
    _child_5 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::end
                         (&(pCVar18->operands).
                           super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                         );
    while (bVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                   operator!=((Iterator *)&__end4_5.index,(Iterator *)&child_5), bVar4) {
      ppEVar201 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                  operator*((Iterator *)&__end4_5.index);
      castLeft_7 = (LocalGet *)*ppEVar201;
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                 ((long)this + 0x48),(value_type *)&castLeft_7);
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::operator++
                ((Iterator *)&__end4_5.index);
    }
    bVar4 = HeapType::operator!=(&pCVar17->heapType,&pCVar18->heapType);
    if (bVar4) {
      return false;
    }
    if ((pCVar17->isReturn & 1U) != (pCVar18->isReturn & 1U)) {
      return false;
    }
    break;
  case LocalGetId:
    pLVar19 = Expression::cast<wasm::LocalGet>(left);
    pLVar20 = Expression::cast<wasm::LocalGet>(right);
    if (pLVar19->index != pLVar20->index) {
      return false;
    }
    break;
  case LocalSetId:
    pLVar21 = Expression::cast<wasm::LocalSet>(left);
    pLVar22 = Expression::cast<wasm::LocalSet>(right);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pLVar21->value);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pLVar22->value);
    if (pLVar21->index != pLVar22->index) {
      return false;
    }
    break;
  case GlobalGetId:
    pGVar23 = Expression::cast<wasm::GlobalGet>(left);
    pGVar24 = Expression::cast<wasm::GlobalGet>(right);
    bVar4 = IString::operator!=(&(pGVar23->name).super_IString,&(pGVar24->name).super_IString);
    if (bVar4) {
      return false;
    }
    break;
  case GlobalSetId:
    pGVar25 = Expression::cast<wasm::GlobalSet>(left);
    pGVar26 = Expression::cast<wasm::GlobalSet>(right);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pGVar25->value);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pGVar26->value);
    bVar4 = IString::operator!=(&(pGVar25->name).super_IString,&(pGVar26->name).super_IString);
    if (bVar4) {
      return false;
    }
    break;
  case LoadId:
    pLVar27 = Expression::cast<wasm::Load>(left);
    pLVar28 = Expression::cast<wasm::Load>(right);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pLVar27->ptr);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pLVar28->ptr);
    if (pLVar27->bytes != pLVar28->bytes) {
      return false;
    }
    if ((pLVar27->signed_ & 1U) != (pLVar28->signed_ & 1U)) {
      return false;
    }
    aVar58 = wasm::Address::operator_cast_to_unsigned_long(&pLVar27->offset);
    aVar59 = wasm::Address::operator_cast_to_unsigned_long(&pLVar28->offset);
    if (aVar58 != aVar59) {
      return false;
    }
    aVar58 = wasm::Address::operator_cast_to_unsigned_long(&pLVar27->align);
    aVar59 = wasm::Address::operator_cast_to_unsigned_long(&pLVar28->align);
    if (aVar58 != aVar59) {
      return false;
    }
    if ((pLVar27->isAtomic & 1U) != (pLVar28->isAtomic & 1U)) {
      return false;
    }
    bVar4 = IString::operator!=(&(pLVar27->memory).super_IString,&(pLVar28->memory).super_IString);
    if (bVar4) {
      return false;
    }
    break;
  case StoreId:
    pSVar29 = Expression::cast<wasm::Store>(left);
    pSVar30 = Expression::cast<wasm::Store>(right);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pSVar29->value);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pSVar30->value);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pSVar29->ptr);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pSVar30->ptr);
    if (pSVar29->bytes != pSVar30->bytes) {
      return false;
    }
    aVar58 = wasm::Address::operator_cast_to_unsigned_long(&pSVar29->offset);
    aVar59 = wasm::Address::operator_cast_to_unsigned_long(&pSVar30->offset);
    if (aVar58 != aVar59) {
      return false;
    }
    aVar58 = wasm::Address::operator_cast_to_unsigned_long(&pSVar29->align);
    aVar59 = wasm::Address::operator_cast_to_unsigned_long(&pSVar30->align);
    if (aVar58 != aVar59) {
      return false;
    }
    if ((pSVar29->isAtomic & 1U) != (pSVar30->isAtomic & 1U)) {
      return false;
    }
    bVar4 = wasm::Type::operator!=(&pSVar29->valueType,&pSVar30->valueType);
    if (bVar4) {
      return false;
    }
    bVar4 = IString::operator!=(&(pSVar29->memory).super_IString,&(pSVar30->memory).super_IString);
    if (bVar4) {
      return false;
    }
    break;
  case ConstId:
    pCVar68 = Expression::cast<wasm::Const>(left);
    pCVar69 = Expression::cast<wasm::Const>(right);
    bVar4 = wasm::Literal::operator!=(&pCVar68->value,&pCVar69->value);
    if (bVar4) {
      return false;
    }
    break;
  case UnaryId:
    pUVar70 = Expression::cast<wasm::Unary>(left);
    pUVar71 = Expression::cast<wasm::Unary>(right);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pUVar70->value);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pUVar71->value);
    if (pUVar70->op != pUVar71->op) {
      return false;
    }
    break;
  case BinaryId:
    pBVar72 = Expression::cast<wasm::Binary>(left);
    pBVar73 = Expression::cast<wasm::Binary>(right);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pBVar72->right);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pBVar73->right);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pBVar72->left);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pBVar73->left);
    if (pBVar72->op != pBVar73->op) {
      return false;
    }
    break;
  case SelectId:
    pSVar74 = Expression::cast<wasm::Select>(left);
    pSVar75 = Expression::cast<wasm::Select>(right);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pSVar74->condition);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pSVar75->condition);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pSVar74->ifFalse);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pSVar75->ifFalse);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pSVar74->ifTrue);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pSVar75->ifTrue);
    break;
  case DropId:
    pDVar76 = Expression::cast<wasm::Drop>(left);
    pDVar77 = Expression::cast<wasm::Drop>(right);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pDVar76->value);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pDVar77->value);
    break;
  case ReturnId:
    pRVar78 = Expression::cast<wasm::Return>(left);
    pRVar79 = Expression::cast<wasm::Return>(right);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pRVar78->value);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pRVar79->value);
    break;
  case MemorySizeId:
    pMVar80 = Expression::cast<wasm::MemorySize>(left);
    pMVar81 = Expression::cast<wasm::MemorySize>(right);
    bVar4 = IString::operator!=(&(pMVar80->memory).super_IString,&(pMVar81->memory).super_IString);
    if (bVar4) {
      return false;
    }
    break;
  case MemoryGrowId:
    pMVar82 = Expression::cast<wasm::MemoryGrow>(left);
    pMVar83 = Expression::cast<wasm::MemoryGrow>(right);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pMVar82->delta);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pMVar83->delta);
    bVar4 = IString::operator!=(&(pMVar82->memory).super_IString,&(pMVar83->memory).super_IString);
    if (bVar4) {
      return false;
    }
    break;
  case NopId:
    Expression::cast<wasm::Nop>(left);
    Expression::cast<wasm::Nop>(right);
    break;
  case UnreachableId:
    Expression::cast<wasm::Unreachable>(left);
    Expression::cast<wasm::Unreachable>(right);
    break;
  case AtomicRMWId:
    pAVar31 = Expression::cast<wasm::AtomicRMW>(left);
    pAVar32 = Expression::cast<wasm::AtomicRMW>(right);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pAVar31->value);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pAVar32->value);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pAVar31->ptr);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pAVar32->ptr);
    if (pAVar31->op != pAVar32->op) {
      return false;
    }
    if (pAVar31->bytes != pAVar32->bytes) {
      return false;
    }
    aVar58 = wasm::Address::operator_cast_to_unsigned_long(&pAVar31->offset);
    aVar59 = wasm::Address::operator_cast_to_unsigned_long(&pAVar32->offset);
    if (aVar58 != aVar59) {
      return false;
    }
    bVar4 = IString::operator!=(&(pAVar31->memory).super_IString,&(pAVar32->memory).super_IString);
    if (bVar4) {
      return false;
    }
    break;
  case AtomicCmpxchgId:
    pAVar33 = Expression::cast<wasm::AtomicCmpxchg>(left);
    pAVar34 = Expression::cast<wasm::AtomicCmpxchg>(right);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pAVar33->replacement);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pAVar34->replacement);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pAVar33->expected);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pAVar34->expected);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pAVar33->ptr);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pAVar34->ptr);
    if (pAVar33->bytes != pAVar34->bytes) {
      return false;
    }
    aVar58 = wasm::Address::operator_cast_to_unsigned_long(&pAVar33->offset);
    aVar59 = wasm::Address::operator_cast_to_unsigned_long(&pAVar34->offset);
    if (aVar58 != aVar59) {
      return false;
    }
    bVar4 = IString::operator!=(&(pAVar33->memory).super_IString,&(pAVar34->memory).super_IString);
    if (bVar4) {
      return false;
    }
    break;
  case AtomicWaitId:
    pAVar35 = Expression::cast<wasm::AtomicWait>(left);
    pAVar36 = Expression::cast<wasm::AtomicWait>(right);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pAVar35->timeout);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pAVar36->timeout);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pAVar35->expected);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pAVar36->expected);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pAVar35->ptr);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pAVar36->ptr);
    aVar58 = wasm::Address::operator_cast_to_unsigned_long(&pAVar35->offset);
    aVar59 = wasm::Address::operator_cast_to_unsigned_long(&pAVar36->offset);
    if (aVar58 != aVar59) {
      return false;
    }
    bVar4 = wasm::Type::operator!=(&pAVar35->expectedType,&pAVar36->expectedType);
    if (bVar4) {
      return false;
    }
    bVar4 = IString::operator!=(&(pAVar35->memory).super_IString,&(pAVar36->memory).super_IString);
    if (bVar4) {
      return false;
    }
    break;
  case AtomicNotifyId:
    pAVar37 = Expression::cast<wasm::AtomicNotify>(left);
    pAVar38 = Expression::cast<wasm::AtomicNotify>(right);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pAVar37->notifyCount);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pAVar38->notifyCount);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pAVar37->ptr);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pAVar38->ptr);
    aVar58 = wasm::Address::operator_cast_to_unsigned_long(&pAVar37->offset);
    aVar59 = wasm::Address::operator_cast_to_unsigned_long(&pAVar38->offset);
    if (aVar58 != aVar59) {
      return false;
    }
    bVar4 = IString::operator!=(&(pAVar37->memory).super_IString,&(pAVar38->memory).super_IString);
    if (bVar4) {
      return false;
    }
    break;
  case AtomicFenceId:
    pAVar39 = Expression::cast<wasm::AtomicFence>(left);
    pAVar40 = Expression::cast<wasm::AtomicFence>(right);
    if (pAVar39->order != pAVar40->order) {
      return false;
    }
    break;
  case SIMDExtractId:
    pSVar41 = Expression::cast<wasm::SIMDExtract>(left);
    pSVar42 = Expression::cast<wasm::SIMDExtract>(right);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pSVar41->vec);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pSVar42->vec);
    if (pSVar41->op != pSVar42->op) {
      return false;
    }
    if (pSVar41->index != pSVar42->index) {
      return false;
    }
    break;
  case SIMDReplaceId:
    pSVar43 = Expression::cast<wasm::SIMDReplace>(left);
    pSVar44 = Expression::cast<wasm::SIMDReplace>(right);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pSVar43->value);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pSVar44->value);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pSVar43->vec);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pSVar44->vec);
    if (pSVar43->op != pSVar44->op) {
      return false;
    }
    if (pSVar43->index != pSVar44->index) {
      return false;
    }
    break;
  case SIMDShuffleId:
    pSVar45 = Expression::cast<wasm::SIMDShuffle>(left);
    pSVar46 = Expression::cast<wasm::SIMDShuffle>(right);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pSVar45->right);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pSVar46->right);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pSVar45->left);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pSVar46->left);
    sVar47 = std::array<unsigned_char,_16UL>::size(&pSVar45->mask);
    sVar48 = std::array<unsigned_char,_16UL>::size(&pSVar46->mask);
    if (sVar47 != sVar48) {
      return false;
    }
    for (castLeft_21._4_4_ = 0; sVar47 = std::array<unsigned_char,_16UL>::size(&pSVar45->mask),
        castLeft_21._4_4_ < sVar47; castLeft_21._4_4_ = castLeft_21._4_4_ + 1) {
      pvVar49 = std::array<unsigned_char,_16UL>::operator[](&pSVar45->mask,(ulong)castLeft_21._4_4_)
      ;
      vVar1 = *pvVar49;
      pvVar49 = std::array<unsigned_char,_16UL>::operator[](&pSVar46->mask,(ulong)castLeft_21._4_4_)
      ;
      if (vVar1 != *pvVar49) {
        return false;
      }
    }
    break;
  case SIMDTernaryId:
    pSVar50 = Expression::cast<wasm::SIMDTernary>(left);
    pSVar51 = Expression::cast<wasm::SIMDTernary>(right);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pSVar50->c);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pSVar51->c);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pSVar50->b);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pSVar51->b);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pSVar50->a);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pSVar51->a);
    if (pSVar50->op != pSVar51->op) {
      return false;
    }
    break;
  case SIMDShiftId:
    pSVar52 = Expression::cast<wasm::SIMDShift>(left);
    pSVar53 = Expression::cast<wasm::SIMDShift>(right);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pSVar52->shift);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pSVar53->shift);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pSVar52->vec);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pSVar53->vec);
    if (pSVar52->op != pSVar53->op) {
      return false;
    }
    break;
  case SIMDLoadId:
    pSVar54 = Expression::cast<wasm::SIMDLoad>(left);
    pSVar55 = Expression::cast<wasm::SIMDLoad>(right);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pSVar54->ptr);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pSVar55->ptr);
    if (pSVar54->op != pSVar55->op) {
      return false;
    }
    aVar58 = wasm::Address::operator_cast_to_unsigned_long(&pSVar54->offset);
    aVar59 = wasm::Address::operator_cast_to_unsigned_long(&pSVar55->offset);
    if (aVar58 != aVar59) {
      return false;
    }
    aVar58 = wasm::Address::operator_cast_to_unsigned_long(&pSVar54->align);
    aVar59 = wasm::Address::operator_cast_to_unsigned_long(&pSVar55->align);
    if (aVar58 != aVar59) {
      return false;
    }
    bVar4 = IString::operator!=(&(pSVar54->memory).super_IString,&(pSVar55->memory).super_IString);
    if (bVar4) {
      return false;
    }
    break;
  case SIMDLoadStoreLaneId:
    pSVar56 = Expression::cast<wasm::SIMDLoadStoreLane>(left);
    pSVar57 = Expression::cast<wasm::SIMDLoadStoreLane>(right);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pSVar56->vec);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pSVar57->vec);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pSVar56->ptr);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pSVar57->ptr);
    if (pSVar56->op != pSVar57->op) {
      return false;
    }
    aVar58 = wasm::Address::operator_cast_to_unsigned_long(&pSVar56->offset);
    aVar59 = wasm::Address::operator_cast_to_unsigned_long(&pSVar57->offset);
    if (aVar58 != aVar59) {
      return false;
    }
    aVar58 = wasm::Address::operator_cast_to_unsigned_long(&pSVar56->align);
    aVar59 = wasm::Address::operator_cast_to_unsigned_long(&pSVar57->align);
    if (aVar58 != aVar59) {
      return false;
    }
    if (pSVar56->index != pSVar57->index) {
      return false;
    }
    bVar4 = IString::operator!=(&(pSVar56->memory).super_IString,&(pSVar57->memory).super_IString);
    if (bVar4) {
      return false;
    }
    break;
  case MemoryInitId:
    pMVar60 = Expression::cast<wasm::MemoryInit>(left);
    pMVar61 = Expression::cast<wasm::MemoryInit>(right);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pMVar60->size);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pMVar61->size);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pMVar60->offset);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pMVar61->offset);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pMVar60->dest);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pMVar61->dest);
    bVar4 = IString::operator!=(&(pMVar60->segment).super_IString,&(pMVar61->segment).super_IString)
    ;
    if (bVar4) {
      return false;
    }
    bVar4 = IString::operator!=(&(pMVar60->memory).super_IString,&(pMVar61->memory).super_IString);
    if (bVar4) {
      return false;
    }
    break;
  case DataDropId:
    pDVar62 = Expression::cast<wasm::DataDrop>(left);
    pDVar63 = Expression::cast<wasm::DataDrop>(right);
    bVar4 = IString::operator!=(&(pDVar62->segment).super_IString,&(pDVar63->segment).super_IString)
    ;
    if (bVar4) {
      return false;
    }
    break;
  case MemoryCopyId:
    pMVar64 = Expression::cast<wasm::MemoryCopy>(left);
    pMVar65 = Expression::cast<wasm::MemoryCopy>(right);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pMVar64->size);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pMVar65->size);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pMVar64->source);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pMVar65->source);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pMVar64->dest);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pMVar65->dest);
    bVar4 = IString::operator!=(&(pMVar64->sourceMemory).super_IString,
                                &(pMVar65->sourceMemory).super_IString);
    if (bVar4) {
      return false;
    }
    bVar4 = IString::operator!=(&(pMVar64->destMemory).super_IString,
                                &(pMVar65->destMemory).super_IString);
    if (bVar4) {
      return false;
    }
    break;
  case MemoryFillId:
    pMVar66 = Expression::cast<wasm::MemoryFill>(left);
    pMVar67 = Expression::cast<wasm::MemoryFill>(right);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pMVar66->size);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pMVar67->size);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pMVar66->value);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pMVar67->value);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pMVar66->dest);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pMVar67->dest);
    bVar4 = IString::operator!=(&(pMVar66->memory).super_IString,&(pMVar67->memory).super_IString);
    if (bVar4) {
      return false;
    }
    break;
  case PopId:
    Expression::cast<wasm::Pop>(left);
    Expression::cast<wasm::Pop>(right);
    break;
  case RefNullId:
    Expression::cast<wasm::RefNull>(left);
    Expression::cast<wasm::RefNull>(right);
    break;
  case RefIsNullId:
    pRVar84 = Expression::cast<wasm::RefIsNull>(left);
    pRVar85 = Expression::cast<wasm::RefIsNull>(right);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pRVar84->value);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pRVar85->value);
    break;
  case RefFuncId:
    pRVar86 = Expression::cast<wasm::RefFunc>(left);
    pRVar87 = Expression::cast<wasm::RefFunc>(right);
    bVar4 = IString::operator!=(&(pRVar86->func).super_IString,&(pRVar87->func).super_IString);
    if (bVar4) {
      return false;
    }
    break;
  case RefEqId:
    pRVar88 = Expression::cast<wasm::RefEq>(left);
    pRVar89 = Expression::cast<wasm::RefEq>(right);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pRVar88->right);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pRVar89->right);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pRVar88->left);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pRVar89->left);
    break;
  case TableGetId:
    pTVar90 = Expression::cast<wasm::TableGet>(left);
    pTVar91 = Expression::cast<wasm::TableGet>(right);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pTVar90->index);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pTVar91->index);
    bVar4 = IString::operator!=(&(pTVar90->table).super_IString,&(pTVar91->table).super_IString);
    if (bVar4) {
      return false;
    }
    break;
  case TableSetId:
    pTVar92 = Expression::cast<wasm::TableSet>(left);
    pTVar93 = Expression::cast<wasm::TableSet>(right);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pTVar92->value);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pTVar93->value);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pTVar92->index);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pTVar93->index);
    bVar4 = IString::operator!=(&(pTVar92->table).super_IString,&(pTVar93->table).super_IString);
    if (bVar4) {
      return false;
    }
    break;
  case TableSizeId:
    pTVar94 = Expression::cast<wasm::TableSize>(left);
    pTVar95 = Expression::cast<wasm::TableSize>(right);
    bVar4 = IString::operator!=(&(pTVar94->table).super_IString,&(pTVar95->table).super_IString);
    if (bVar4) {
      return false;
    }
    break;
  case TableGrowId:
    pTVar96 = Expression::cast<wasm::TableGrow>(left);
    pTVar97 = Expression::cast<wasm::TableGrow>(right);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pTVar96->delta);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pTVar97->delta);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pTVar96->value);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pTVar97->value);
    bVar4 = IString::operator!=(&(pTVar96->table).super_IString,&(pTVar97->table).super_IString);
    if (bVar4) {
      return false;
    }
    break;
  case TableFillId:
    pTVar98 = Expression::cast<wasm::TableFill>(left);
    pTVar99 = Expression::cast<wasm::TableFill>(right);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pTVar98->size);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pTVar99->size);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pTVar98->value);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pTVar99->value);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pTVar98->dest);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pTVar99->dest);
    bVar4 = IString::operator!=(&(pTVar98->table).super_IString,&(pTVar99->table).super_IString);
    if (bVar4) {
      return false;
    }
    break;
  case TableCopyId:
    pTVar100 = Expression::cast<wasm::TableCopy>(left);
    pTVar101 = Expression::cast<wasm::TableCopy>(right);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pTVar100->size);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pTVar101->size);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pTVar100->source);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pTVar101->source);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pTVar100->dest);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pTVar101->dest);
    bVar4 = IString::operator!=(&(pTVar100->sourceTable).super_IString,
                                &(pTVar101->sourceTable).super_IString);
    if (bVar4) {
      return false;
    }
    bVar4 = IString::operator!=(&(pTVar100->destTable).super_IString,
                                &(pTVar101->destTable).super_IString);
    if (bVar4) {
      return false;
    }
    break;
  case TableInitId:
    pTVar102 = Expression::cast<wasm::TableInit>(left);
    pTVar103 = Expression::cast<wasm::TableInit>(right);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pTVar102->size);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pTVar103->size);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pTVar102->offset);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pTVar103->offset);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pTVar102->dest);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pTVar103->dest);
    bVar4 = IString::operator!=(&(pTVar102->segment).super_IString,
                                &(pTVar103->segment).super_IString);
    if (bVar4) {
      return false;
    }
    bVar4 = IString::operator!=(&(pTVar102->table).super_IString,&(pTVar103->table).super_IString);
    if (bVar4) {
      return false;
    }
    break;
  case TryId:
    pTVar104 = Expression::cast<wasm::Try>(left);
    pTVar105 = Expression::cast<wasm::Try>(right);
    bVar4 = compareNames(wasm::Name,wasm::Name_
                      (this,(Name)(pTVar104->delegateTarget).super_IString.str,
                       (Name)(pTVar105->delegateTarget).super_IString.str);
    if (!bVar4) {
      return false;
    }
    sVar199 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                        (&(pTVar104->catchBodies).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                        );
    sVar200 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                        (&(pTVar105->catchBodies).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                        );
    if (sVar199 != sVar200) {
      return false;
    }
    join_0x00000010_0x00000000_ =
         ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::begin
                   (&(pTVar104->catchBodies).
                     super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>);
    _child_6 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::end
                         (&(pTVar104->catchBodies).
                           super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                         );
    while (bVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                   operator!=((Iterator *)&__end4_6.index,(Iterator *)&child_6), bVar4) {
      ppEVar201 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                  operator*((Iterator *)&__end4_6.index);
      __range4_7 = (ExpressionList *)*ppEVar201;
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                 ((long)this + 0x30),(value_type *)&__range4_7);
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::operator++
                ((Iterator *)&__end4_6.index);
    }
    join_0x00000010_0x00000000_ =
         ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::begin
                   (&(pTVar105->catchBodies).
                     super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>);
    _child_7 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::end
                         (&(pTVar105->catchBodies).
                           super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                         );
    while (bVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                   operator!=((Iterator *)&__end4_7.index,(Iterator *)&child_7), bVar4) {
      ppEVar201 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                  operator*((Iterator *)&__end4_7.index);
      pEStack_548 = *ppEVar201;
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                 ((long)this + 0x48),&stack0xfffffffffffffab8);
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::operator++
                ((Iterator *)&__end4_7.index);
    }
    sVar199 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::size
                        (&(pTVar104->catchTags).
                          super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>);
    sVar200 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::size
                        (&(pTVar105->catchTags).
                          super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>);
    if (sVar199 != sVar200) {
      return false;
    }
    for (castLeft_49._4_4_ = 0;
        sVar199 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::size
                            (&(pTVar104->catchTags).
                              super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>),
        castLeft_49._4_4_ < sVar199; castLeft_49._4_4_ = castLeft_49._4_4_ + 1) {
      pIVar195 = &ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::operator[]
                            (&(pTVar104->catchTags).
                              super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>,
                             (ulong)castLeft_49._4_4_)->super_IString;
      pIVar196 = &ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::operator[]
                            (&(pTVar105->catchTags).
                              super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>,
                             (ulong)castLeft_49._4_4_)->super_IString;
      bVar4 = IString::operator!=(pIVar195,pIVar196);
      if (bVar4) {
        return false;
      }
    }
    bVar4 = IString::is(&(pTVar104->name).super_IString);
    bVar3 = IString::is(&(pTVar105->name).super_IString);
    if (bVar4 != bVar3) {
      return false;
    }
    pmVar106 = std::
               map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
               ::operator[]((map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                             *)this,&pTVar104->name);
    wasm::Name::operator=(pmVar106,&pTVar105->name);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pTVar104->body);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pTVar105->body);
    break;
  case TryTableId:
    pTVar107 = Expression::cast<wasm::TryTable>(left);
    pTVar108 = Expression::cast<wasm::TryTable>(right);
    sVar199 = ArenaVectorBase<ArenaVector<wasm::Type>,_wasm::Type>::size
                        (&(pTVar107->sentTypes).
                          super_ArenaVectorBase<ArenaVector<wasm::Type>,_wasm::Type>);
    sVar200 = ArenaVectorBase<ArenaVector<wasm::Type>,_wasm::Type>::size
                        (&(pTVar108->sentTypes).
                          super_ArenaVectorBase<ArenaVector<wasm::Type>,_wasm::Type>);
    if (sVar199 != sVar200) {
      return false;
    }
    for (i_5 = 0; sVar199 = ArenaVectorBase<ArenaVector<wasm::Type>,_wasm::Type>::size
                                      (&(pTVar107->sentTypes).
                                        super_ArenaVectorBase<ArenaVector<wasm::Type>,_wasm::Type>),
        i_5 < sVar199; i_5 = i_5 + 1) {
      pTVar192 = ArenaVectorBase<ArenaVector<wasm::Type>,_wasm::Type>::operator[]
                           (&(pTVar107->sentTypes).
                             super_ArenaVectorBase<ArenaVector<wasm::Type>,_wasm::Type>,(ulong)i_5);
      pTVar193 = ArenaVectorBase<ArenaVector<wasm::Type>,_wasm::Type>::operator[]
                           (&(pTVar108->sentTypes).
                             super_ArenaVectorBase<ArenaVector<wasm::Type>,_wasm::Type>,(ulong)i_5);
      bVar4 = wasm::Type::operator!=(pTVar192,pTVar193);
      if (bVar4) {
        return false;
      }
    }
    sVar199 = ArenaVectorBase<ArenaVector<bool>,_bool>::size
                        (&(pTVar107->catchRefs).super_ArenaVectorBase<ArenaVector<bool>,_bool>);
    sVar200 = ArenaVectorBase<ArenaVector<bool>,_bool>::size
                        (&(pTVar108->catchRefs).super_ArenaVectorBase<ArenaVector<bool>,_bool>);
    if (sVar199 != sVar200) {
      return false;
    }
    for (local_568 = 0;
        sVar199 = ArenaVectorBase<ArenaVector<bool>,_bool>::size
                            (&(pTVar107->catchRefs).super_ArenaVectorBase<ArenaVector<bool>,_bool>),
        local_568 < sVar199; local_568 = local_568 + 1) {
      pbVar109 = ArenaVectorBase<ArenaVector<bool>,_bool>::operator[]
                           (&(pTVar107->catchRefs).super_ArenaVectorBase<ArenaVector<bool>,_bool>,
                            (ulong)local_568);
      bVar4 = *pbVar109;
      pbVar109 = ArenaVectorBase<ArenaVector<bool>,_bool>::operator[]
                           (&(pTVar108->catchRefs).super_ArenaVectorBase<ArenaVector<bool>,_bool>,
                            (ulong)local_568);
      if ((bVar4 & 1U) != (*pbVar109 & 1U)) {
        return false;
      }
    }
    sVar199 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::size
                        (&(pTVar107->catchDests).
                          super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>);
    sVar200 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::size
                        (&(pTVar108->catchDests).
                          super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>);
    if (sVar199 != sVar200) {
      return false;
    }
    for (local_56c = 0;
        sVar199 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::size
                            (&(pTVar107->catchDests).
                              super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>),
        local_56c < sVar199; local_56c = local_56c + 1) {
      pNVar194 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::operator[]
                           (&(pTVar107->catchDests).
                             super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>,
                            (ulong)local_56c);
      sVar2 = (pNVar194->super_IString).str;
      pNVar194 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::operator[]
                           (&(pTVar108->catchDests).
                             super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>,
                            (ulong)local_56c);
      bVar4 = compareNames(wasm::Name,wasm::Name_
                        (this,(Name)sVar2,(Name)(pNVar194->super_IString).str);
      if (!bVar4) {
        return false;
      }
    }
    sVar199 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::size
                        (&(pTVar107->catchTags).
                          super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>);
    sVar200 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::size
                        (&(pTVar108->catchTags).
                          super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>);
    if (sVar199 != sVar200) {
      return false;
    }
    for (castLeft_50._4_4_ = 0;
        sVar199 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::size
                            (&(pTVar107->catchTags).
                              super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>),
        castLeft_50._4_4_ < sVar199; castLeft_50._4_4_ = castLeft_50._4_4_ + 1) {
      pIVar195 = &ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::operator[]
                            (&(pTVar107->catchTags).
                              super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>,
                             (ulong)castLeft_50._4_4_)->super_IString;
      pIVar196 = &ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::operator[]
                            (&(pTVar108->catchTags).
                              super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>,
                             (ulong)castLeft_50._4_4_)->super_IString;
      bVar4 = IString::operator!=(pIVar195,pIVar196);
      if (bVar4) {
        return false;
      }
    }
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pTVar107->body);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pTVar108->body);
    break;
  case ThrowId:
    pTVar110 = Expression::cast<wasm::Throw>(left);
    pTVar111 = Expression::cast<wasm::Throw>(right);
    sVar199 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                        (&(pTVar110->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                        );
    sVar200 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                        (&(pTVar111->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                        );
    if (sVar199 != sVar200) {
      return false;
    }
    join_0x00000010_0x00000000_ =
         ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::begin
                   (&(pTVar110->operands).
                     super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>);
    _child_8 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::end
                         (&(pTVar110->operands).
                           super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                         );
    while (bVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                   operator!=((Iterator *)&__end4_8.index,(Iterator *)&child_8), bVar4) {
      ppEVar201 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                  operator*((Iterator *)&__end4_8.index);
      __range4_9 = (ExpressionList *)*ppEVar201;
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                 ((long)this + 0x30),(value_type *)&__range4_9);
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::operator++
                ((Iterator *)&__end4_8.index);
    }
    join_0x00000010_0x00000000_ =
         ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::begin
                   (&(pTVar111->operands).
                     super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>);
    _child_9 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::end
                         (&(pTVar111->operands).
                           super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                         );
    while (bVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                   operator!=((Iterator *)&__end4_9.index,(Iterator *)&child_9), bVar4) {
      ppEVar201 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                  operator*((Iterator *)&__end4_9.index);
      castLeft_51 = (Rethrow *)*ppEVar201;
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                 ((long)this + 0x48),(value_type *)&castLeft_51);
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::operator++
                ((Iterator *)&__end4_9.index);
    }
    bVar4 = IString::operator!=(&(pTVar110->tag).super_IString,&(pTVar111->tag).super_IString);
    if (bVar4) {
      return false;
    }
    break;
  case RethrowId:
    pRVar112 = Expression::cast<wasm::Rethrow>(left);
    pRVar113 = Expression::cast<wasm::Rethrow>(right);
    bVar4 = compareNames(wasm::Name,wasm::Name_
                      (this,(Name)(pRVar112->target).super_IString.str,
                       (Name)(pRVar113->target).super_IString.str);
    if (!bVar4) {
      return false;
    }
    break;
  case ThrowRefId:
    pTVar114 = Expression::cast<wasm::ThrowRef>(left);
    pTVar115 = Expression::cast<wasm::ThrowRef>(right);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pTVar114->exnref);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pTVar115->exnref);
    break;
  case TupleMakeId:
    pTVar116 = Expression::cast<wasm::TupleMake>(left);
    pTVar117 = Expression::cast<wasm::TupleMake>(right);
    sVar199 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                        (&(pTVar116->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                        );
    sVar200 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                        (&(pTVar117->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                        );
    if (sVar199 != sVar200) {
      return false;
    }
    join_0x00000010_0x00000000_ =
         ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::begin
                   (&(pTVar116->operands).
                     super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>);
    _child_10 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::end
                          (&(pTVar116->operands).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          );
    while (bVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                   operator!=((Iterator *)&__end4_10.index,(Iterator *)&child_10), bVar4) {
      ppEVar201 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                  operator*((Iterator *)&__end4_10.index);
      __range4_11 = (ExpressionList *)*ppEVar201;
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                 ((long)this + 0x30),(value_type *)&__range4_11);
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::operator++
                ((Iterator *)&__end4_10.index);
    }
    join_0x00000010_0x00000000_ =
         ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::begin
                   (&(pTVar117->operands).
                     super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>);
    _child_11 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::end
                          (&(pTVar117->operands).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          );
    while (bVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                   operator!=((Iterator *)&__end4_11.index,(Iterator *)&child_11), bVar4) {
      ppEVar201 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                  operator*((Iterator *)&__end4_11.index);
      castLeft_57 = (TupleExtract *)*ppEVar201;
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                 ((long)this + 0x48),(value_type *)&castLeft_57);
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::operator++
                ((Iterator *)&__end4_11.index);
    }
    break;
  case TupleExtractId:
    pTVar118 = Expression::cast<wasm::TupleExtract>(left);
    pTVar119 = Expression::cast<wasm::TupleExtract>(right);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pTVar118->tuple);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pTVar119->tuple);
    if (pTVar118->index != pTVar119->index) {
      return false;
    }
    break;
  case RefI31Id:
    pRVar120 = Expression::cast<wasm::RefI31>(left);
    pRVar121 = Expression::cast<wasm::RefI31>(right);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pRVar120->value);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pRVar121->value);
    break;
  case I31GetId:
    pIVar122 = Expression::cast<wasm::I31Get>(left);
    pIVar123 = Expression::cast<wasm::I31Get>(right);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pIVar122->i31);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pIVar123->i31);
    if ((pIVar122->signed_ & 1U) != (pIVar123->signed_ & 1U)) {
      return false;
    }
    break;
  case CallRefId:
    pCVar124 = Expression::cast<wasm::CallRef>(left);
    pCVar125 = Expression::cast<wasm::CallRef>(right);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pCVar124->target);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pCVar125->target);
    sVar199 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                        (&(pCVar124->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                        );
    sVar200 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                        (&(pCVar125->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                        );
    if (sVar199 != sVar200) {
      return false;
    }
    join_0x00000010_0x00000000_ =
         ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::begin
                   (&(pCVar124->operands).
                     super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>);
    _child_12 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::end
                          (&(pCVar124->operands).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          );
    while (bVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                   operator!=((Iterator *)&__end4_12.index,(Iterator *)&child_12), bVar4) {
      ppEVar201 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                  operator*((Iterator *)&__end4_12.index);
      __range4_13 = (ExpressionList *)*ppEVar201;
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                 ((long)this + 0x30),(value_type *)&__range4_13);
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::operator++
                ((Iterator *)&__end4_12.index);
    }
    join_0x00000010_0x00000000_ =
         ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::begin
                   (&(pCVar125->operands).
                     super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>);
    _child_13 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::end
                          (&(pCVar125->operands).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          );
    while (bVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                   operator!=((Iterator *)&__end4_13.index,(Iterator *)&child_13), bVar4) {
      ppEVar201 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                  operator*((Iterator *)&__end4_13.index);
      castLeft_61 = (RefTest *)*ppEVar201;
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                 ((long)this + 0x48),(value_type *)&castLeft_61);
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::operator++
                ((Iterator *)&__end4_13.index);
    }
    if ((pCVar124->isReturn & 1U) != (pCVar125->isReturn & 1U)) {
      return false;
    }
    break;
  case RefTestId:
    pRVar126 = Expression::cast<wasm::RefTest>(left);
    pRVar127 = Expression::cast<wasm::RefTest>(right);
    bVar4 = wasm::Type::operator!=(&pRVar126->castType,&pRVar127->castType);
    if (bVar4) {
      return false;
    }
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pRVar126->ref);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pRVar127->ref);
    break;
  case RefCastId:
    pRVar128 = Expression::cast<wasm::RefCast>(left);
    pRVar129 = Expression::cast<wasm::RefCast>(right);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pRVar128->ref);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pRVar129->ref);
    break;
  case BrOnId:
    pBVar130 = Expression::cast<wasm::BrOn>(left);
    pBVar131 = Expression::cast<wasm::BrOn>(right);
    if (pBVar130->op != pBVar131->op) {
      return false;
    }
    bVar4 = compareNames(wasm::Name,wasm::Name_
                      (this,(Name)(pBVar130->name).super_IString.str,
                       (Name)(pBVar131->name).super_IString.str);
    if (!bVar4) {
      return false;
    }
    bVar4 = wasm::Type::operator!=(&pBVar130->castType,&pBVar131->castType);
    if (bVar4) {
      return false;
    }
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pBVar130->ref);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pBVar131->ref);
    break;
  case StructNewId:
    pSVar132 = Expression::cast<wasm::StructNew>(left);
    pSVar133 = Expression::cast<wasm::StructNew>(right);
    sVar199 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                        (&(pSVar132->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                        );
    sVar200 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                        (&(pSVar133->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                        );
    if (sVar199 != sVar200) {
      return false;
    }
    join_0x00000010_0x00000000_ =
         ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::begin
                   (&(pSVar132->operands).
                     super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>);
    _child_14 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::end
                          (&(pSVar132->operands).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          );
    while (bVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                   operator!=((Iterator *)&__end4_14.index,(Iterator *)&child_14), bVar4) {
      ppEVar201 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                  operator*((Iterator *)&__end4_14.index);
      __range4_15 = (ExpressionList *)*ppEVar201;
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                 ((long)this + 0x30),(value_type *)&__range4_15);
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::operator++
                ((Iterator *)&__end4_14.index);
    }
    join_0x00000010_0x00000000_ =
         ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::begin
                   (&(pSVar133->operands).
                     super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>);
    _child_15 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::end
                          (&(pSVar133->operands).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          );
    while (bVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                   operator!=((Iterator *)&__end4_15.index,(Iterator *)&child_15), bVar4) {
      ppEVar201 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                  operator*((Iterator *)&__end4_15.index);
      castLeft_65 = (StructGet *)*ppEVar201;
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                 ((long)this + 0x48),(value_type *)&castLeft_65);
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::operator++
                ((Iterator *)&__end4_15.index);
    }
    break;
  case StructGetId:
    pSVar134 = Expression::cast<wasm::StructGet>(left);
    pSVar135 = Expression::cast<wasm::StructGet>(right);
    if (pSVar134->index != pSVar135->index) {
      return false;
    }
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pSVar134->ref);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pSVar135->ref);
    if ((pSVar134->signed_ & 1U) != (pSVar135->signed_ & 1U)) {
      return false;
    }
    if (pSVar134->order != pSVar135->order) {
      return false;
    }
    break;
  case StructSetId:
    pSVar136 = Expression::cast<wasm::StructSet>(left);
    pSVar137 = Expression::cast<wasm::StructSet>(right);
    if (pSVar136->index != pSVar137->index) {
      return false;
    }
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pSVar136->value);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pSVar137->value);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pSVar136->ref);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pSVar137->ref);
    if (pSVar136->order != pSVar137->order) {
      return false;
    }
    break;
  case StructRMWId:
    pSVar138 = Expression::cast<wasm::StructRMW>(left);
    pSVar139 = Expression::cast<wasm::StructRMW>(right);
    if (pSVar138->op != pSVar139->op) {
      return false;
    }
    if (pSVar138->index != pSVar139->index) {
      return false;
    }
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pSVar138->value);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pSVar139->value);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pSVar138->ref);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pSVar139->ref);
    if (pSVar138->order != pSVar139->order) {
      return false;
    }
    break;
  case StructCmpxchgId:
    pSVar140 = Expression::cast<wasm::StructCmpxchg>(left);
    pSVar141 = Expression::cast<wasm::StructCmpxchg>(right);
    if (pSVar140->index != pSVar141->index) {
      return false;
    }
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pSVar140->replacement);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pSVar141->replacement);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pSVar140->expected);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pSVar141->expected);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pSVar140->ref);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pSVar141->ref);
    if (pSVar140->order != pSVar141->order) {
      return false;
    }
    break;
  case ArrayNewId:
    pAVar142 = Expression::cast<wasm::ArrayNew>(left);
    pAVar143 = Expression::cast<wasm::ArrayNew>(right);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pAVar142->size);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pAVar143->size);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pAVar142->init);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pAVar143->init);
    break;
  case ArrayNewDataId:
    pAVar144 = Expression::cast<wasm::ArrayNewData>(left);
    pAVar145 = Expression::cast<wasm::ArrayNewData>(right);
    bVar4 = IString::operator!=(&(pAVar144->segment).super_IString,
                                &(pAVar145->segment).super_IString);
    if (bVar4) {
      return false;
    }
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pAVar144->size);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pAVar145->size);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pAVar144->offset);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pAVar145->offset);
    break;
  case ArrayNewElemId:
    pAVar146 = Expression::cast<wasm::ArrayNewElem>(left);
    pAVar147 = Expression::cast<wasm::ArrayNewElem>(right);
    bVar4 = IString::operator!=(&(pAVar146->segment).super_IString,
                                &(pAVar147->segment).super_IString);
    if (bVar4) {
      return false;
    }
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pAVar146->size);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pAVar147->size);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pAVar146->offset);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pAVar147->offset);
    break;
  case ArrayNewFixedId:
    pAVar148 = Expression::cast<wasm::ArrayNewFixed>(left);
    pAVar149 = Expression::cast<wasm::ArrayNewFixed>(right);
    sVar199 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                        (&(pAVar148->values).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                        );
    sVar200 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                        (&(pAVar149->values).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                        );
    if (sVar199 != sVar200) {
      return false;
    }
    join_0x00000010_0x00000000_ =
         ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::begin
                   (&(pAVar148->values).
                     super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>);
    _child_16 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::end
                          (&(pAVar148->values).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          );
    while (bVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                   operator!=((Iterator *)&__end4_16.index,(Iterator *)&child_16), bVar4) {
      ppEVar201 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                  operator*((Iterator *)&__end4_16.index);
      __range4_17 = (ExpressionList *)*ppEVar201;
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                 ((long)this + 0x30),(value_type *)&__range4_17);
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::operator++
                ((Iterator *)&__end4_16.index);
    }
    join_0x00000010_0x00000000_ =
         ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::begin
                   (&(pAVar149->values).
                     super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>);
    _child_17 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::end
                          (&(pAVar149->values).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          );
    while (bVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                   operator!=((Iterator *)&__end4_17.index,(Iterator *)&child_17), bVar4) {
      ppEVar201 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                  operator*((Iterator *)&__end4_17.index);
      castLeft_73 = (ArrayGet *)*ppEVar201;
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                 ((long)this + 0x48),(value_type *)&castLeft_73);
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::operator++
                ((Iterator *)&__end4_17.index);
    }
    break;
  case ArrayGetId:
    pAVar150 = Expression::cast<wasm::ArrayGet>(left);
    pAVar151 = Expression::cast<wasm::ArrayGet>(right);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pAVar150->index);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pAVar151->index);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pAVar150->ref);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pAVar151->ref);
    if ((pAVar150->signed_ & 1U) != (pAVar151->signed_ & 1U)) {
      return false;
    }
    break;
  case ArraySetId:
    pAVar152 = Expression::cast<wasm::ArraySet>(left);
    pAVar153 = Expression::cast<wasm::ArraySet>(right);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pAVar152->value);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pAVar153->value);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pAVar152->index);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pAVar153->index);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pAVar152->ref);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pAVar153->ref);
    break;
  case ArrayLenId:
    pAVar154 = Expression::cast<wasm::ArrayLen>(left);
    pAVar155 = Expression::cast<wasm::ArrayLen>(right);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pAVar154->ref);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pAVar155->ref);
    break;
  case ArrayCopyId:
    pAVar156 = Expression::cast<wasm::ArrayCopy>(left);
    pAVar157 = Expression::cast<wasm::ArrayCopy>(right);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pAVar156->length);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pAVar157->length);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pAVar156->srcIndex);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pAVar157->srcIndex);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pAVar156->srcRef);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pAVar157->srcRef);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pAVar156->destIndex);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pAVar157->destIndex);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pAVar156->destRef);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pAVar157->destRef);
    break;
  case ArrayFillId:
    pAVar158 = Expression::cast<wasm::ArrayFill>(left);
    pAVar159 = Expression::cast<wasm::ArrayFill>(right);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pAVar158->size);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pAVar159->size);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pAVar158->value);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pAVar159->value);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pAVar158->index);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pAVar159->index);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pAVar158->ref);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pAVar159->ref);
    break;
  case ArrayInitDataId:
    pAVar160 = Expression::cast<wasm::ArrayInitData>(left);
    pAVar161 = Expression::cast<wasm::ArrayInitData>(right);
    bVar4 = IString::operator!=(&(pAVar160->segment).super_IString,
                                &(pAVar161->segment).super_IString);
    if (bVar4) {
      return false;
    }
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pAVar160->size);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pAVar161->size);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pAVar160->offset);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pAVar161->offset);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pAVar160->index);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pAVar161->index);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pAVar160->ref);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pAVar161->ref);
    break;
  case ArrayInitElemId:
    pAVar162 = Expression::cast<wasm::ArrayInitElem>(left);
    pAVar163 = Expression::cast<wasm::ArrayInitElem>(right);
    bVar4 = IString::operator!=(&(pAVar162->segment).super_IString,
                                &(pAVar163->segment).super_IString);
    if (bVar4) {
      return false;
    }
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pAVar162->size);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pAVar163->size);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pAVar162->offset);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pAVar163->offset);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pAVar162->index);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pAVar163->index);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pAVar162->ref);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pAVar163->ref);
    break;
  case RefAsId:
    pRVar164 = Expression::cast<wasm::RefAs>(left);
    pRVar165 = Expression::cast<wasm::RefAs>(right);
    if (pRVar164->op != pRVar165->op) {
      return false;
    }
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pRVar164->value);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pRVar165->value);
    break;
  case StringNewId:
    pSVar166 = Expression::cast<wasm::StringNew>(left);
    pSVar167 = Expression::cast<wasm::StringNew>(right);
    if (pSVar166->op != pSVar167->op) {
      return false;
    }
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pSVar166->end);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pSVar167->end);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pSVar166->start);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pSVar167->start);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pSVar166->ref);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pSVar167->ref);
    break;
  case StringConstId:
    pSVar168 = Expression::cast<wasm::StringConst>(left);
    pSVar169 = Expression::cast<wasm::StringConst>(right);
    bVar4 = IString::operator!=(&(pSVar168->string).super_IString,&(pSVar169->string).super_IString)
    ;
    if (bVar4) {
      return false;
    }
    break;
  case StringMeasureId:
    pSVar170 = Expression::cast<wasm::StringMeasure>(left);
    pSVar171 = Expression::cast<wasm::StringMeasure>(right);
    if (pSVar170->op != pSVar171->op) {
      return false;
    }
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pSVar170->ref);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pSVar171->ref);
    break;
  case StringEncodeId:
    pSVar172 = Expression::cast<wasm::StringEncode>(left);
    pSVar173 = Expression::cast<wasm::StringEncode>(right);
    if (pSVar172->op != pSVar173->op) {
      return false;
    }
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pSVar172->start);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pSVar173->start);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pSVar172->array);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pSVar173->array);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pSVar172->str);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pSVar173->str);
    break;
  case StringConcatId:
    pSVar174 = Expression::cast<wasm::StringConcat>(left);
    pSVar175 = Expression::cast<wasm::StringConcat>(right);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pSVar174->right);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pSVar175->right);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pSVar174->left);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pSVar175->left);
    break;
  case StringEqId:
    pSVar176 = Expression::cast<wasm::StringEq>(left);
    pSVar177 = Expression::cast<wasm::StringEq>(right);
    if (pSVar176->op != pSVar177->op) {
      return false;
    }
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pSVar176->right);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pSVar177->right);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pSVar176->left);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pSVar177->left);
    break;
  case StringWTF16GetId:
    pSVar178 = Expression::cast<wasm::StringWTF16Get>(left);
    pSVar179 = Expression::cast<wasm::StringWTF16Get>(right);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pSVar178->pos);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pSVar179->pos);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pSVar178->ref);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pSVar179->ref);
    break;
  case StringSliceWTFId:
    pSVar180 = Expression::cast<wasm::StringSliceWTF>(left);
    pSVar181 = Expression::cast<wasm::StringSliceWTF>(right);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pSVar180->end);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pSVar181->end);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pSVar180->start);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pSVar181->start);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pSVar180->ref);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pSVar181->ref);
    break;
  case ContNewId:
    pCVar182 = Expression::cast<wasm::ContNew>(left);
    pCVar183 = Expression::cast<wasm::ContNew>(right);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pCVar182->func);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pCVar183->func);
    break;
  case ContBindId:
    pCVar184 = Expression::cast<wasm::ContBind>(left);
    pCVar185 = Expression::cast<wasm::ContBind>(right);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pCVar184->cont);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pCVar185->cont);
    sVar199 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                        (&(pCVar184->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                        );
    sVar200 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                        (&(pCVar185->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                        );
    if (sVar199 != sVar200) {
      return false;
    }
    join_0x00000010_0x00000000_ =
         ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::begin
                   (&(pCVar184->operands).
                     super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>);
    _child_18 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::end
                          (&(pCVar184->operands).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          );
    while (bVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                   operator!=((Iterator *)&__end4_18.index,(Iterator *)&child_18), bVar4) {
      ppEVar201 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                  operator*((Iterator *)&__end4_18.index);
      __range4_19 = (ExpressionList *)*ppEVar201;
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                 ((long)this + 0x30),(value_type *)&__range4_19);
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::operator++
                ((Iterator *)&__end4_18.index);
    }
    join_0x00000010_0x00000000_ =
         ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::begin
                   (&(pCVar185->operands).
                     super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>);
    _child_19 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::end
                          (&(pCVar185->operands).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          );
    while (bVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                   operator!=((Iterator *)&__end4_19.index,(Iterator *)&child_19), bVar4) {
      ppEVar201 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                  operator*((Iterator *)&__end4_19.index);
      castLeft_91 = (Suspend *)*ppEVar201;
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                 ((long)this + 0x48),(value_type *)&castLeft_91);
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::operator++
                ((Iterator *)&__end4_19.index);
    }
    break;
  case SuspendId:
    pSVar186 = Expression::cast<wasm::Suspend>(left);
    pSVar187 = Expression::cast<wasm::Suspend>(right);
    sVar199 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                        (&(pSVar186->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                        );
    sVar200 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                        (&(pSVar187->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                        );
    if (sVar199 != sVar200) {
      return false;
    }
    join_0x00000010_0x00000000_ =
         ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::begin
                   (&(pSVar186->operands).
                     super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>);
    _child_20 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::end
                          (&(pSVar186->operands).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          );
    while (bVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                   operator!=((Iterator *)&__end4_20.index,(Iterator *)&child_20), bVar4) {
      ppEVar201 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                  operator*((Iterator *)&__end4_20.index);
      __range4_21 = (ExpressionList *)*ppEVar201;
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                 ((long)this + 0x30),(value_type *)&__range4_21);
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::operator++
                ((Iterator *)&__end4_20.index);
    }
    join_0x00000010_0x00000000_ =
         ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::begin
                   (&(pSVar187->operands).
                     super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>);
    _child_21 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::end
                          (&(pSVar187->operands).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          );
    while (bVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                   operator!=((Iterator *)&__end4_21.index,(Iterator *)&child_21), bVar4) {
      ppEVar201 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                  operator*((Iterator *)&__end4_21.index);
      castLeft_92 = (Resume *)*ppEVar201;
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                 ((long)this + 0x48),(value_type *)&castLeft_92);
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::operator++
                ((Iterator *)&__end4_21.index);
    }
    bVar4 = IString::operator!=(&(pSVar186->tag).super_IString,&(pSVar187->tag).super_IString);
    if (bVar4) {
      return false;
    }
    break;
  case ResumeId:
    pRVar188 = Expression::cast<wasm::Resume>(left);
    pRVar189 = Expression::cast<wasm::Resume>(right);
    sVar199 = ArenaVectorBase<ArenaVector<wasm::Type>,_wasm::Type>::size
                        (&(pRVar188->sentTypes).
                          super_ArenaVectorBase<ArenaVector<wasm::Type>,_wasm::Type>);
    sVar200 = ArenaVectorBase<ArenaVector<wasm::Type>,_wasm::Type>::size
                        (&(pRVar189->sentTypes).
                          super_ArenaVectorBase<ArenaVector<wasm::Type>,_wasm::Type>);
    if (sVar199 != sVar200) {
      return false;
    }
    for (__range4_22._4_4_ = 0;
        sVar199 = ArenaVectorBase<ArenaVector<wasm::Type>,_wasm::Type>::size
                            (&(pRVar188->sentTypes).
                              super_ArenaVectorBase<ArenaVector<wasm::Type>,_wasm::Type>),
        __range4_22._4_4_ < sVar199; __range4_22._4_4_ = __range4_22._4_4_ + 1) {
      pTVar192 = ArenaVectorBase<ArenaVector<wasm::Type>,_wasm::Type>::operator[]
                           (&(pRVar188->sentTypes).
                             super_ArenaVectorBase<ArenaVector<wasm::Type>,_wasm::Type>,
                            (ulong)__range4_22._4_4_);
      pTVar193 = ArenaVectorBase<ArenaVector<wasm::Type>,_wasm::Type>::operator[]
                           (&(pRVar189->sentTypes).
                             super_ArenaVectorBase<ArenaVector<wasm::Type>,_wasm::Type>,
                            (ulong)__range4_22._4_4_);
      bVar4 = wasm::Type::operator!=(pTVar192,pTVar193);
      if (bVar4) {
        return false;
      }
    }
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pRVar188->cont);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pRVar189->cont);
    sVar199 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                        (&(pRVar188->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                        );
    sVar200 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                        (&(pRVar189->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                        );
    if (sVar199 != sVar200) {
      return false;
    }
    join_0x00000010_0x00000000_ =
         ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::begin
                   (&(pRVar188->operands).
                     super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>);
    _child_22 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::end
                          (&(pRVar188->operands).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          );
    while (bVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                   operator!=((Iterator *)&__end4_22.index,(Iterator *)&child_22), bVar4) {
      ppEVar201 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                  operator*((Iterator *)&__end4_22.index);
      __range4_23 = (ExpressionList *)*ppEVar201;
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                 ((long)this + 0x30),(value_type *)&__range4_23);
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::operator++
                ((Iterator *)&__end4_22.index);
    }
    join_0x00000010_0x00000000_ =
         ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::begin
                   (&(pRVar189->operands).
                     super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>);
    _child_23 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::end
                          (&(pRVar189->operands).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          );
    while (bVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                   operator!=((Iterator *)&__end4_23.index,(Iterator *)&child_23), bVar4) {
      ppEVar201 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                  operator*((Iterator *)&__end4_23.index);
      pEStack_b90 = *ppEVar201;
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                 ((long)this + 0x48),&stack0xfffffffffffff470);
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::operator++
                ((Iterator *)&__end4_23.index);
    }
    sVar199 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::size
                        (&(pRVar188->handlerBlocks).
                          super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>);
    sVar200 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::size
                        (&(pRVar189->handlerBlocks).
                          super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>);
    if (sVar199 != sVar200) {
      return false;
    }
    for (local_b94 = 0;
        sVar199 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::size
                            (&(pRVar188->handlerBlocks).
                              super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>),
        local_b94 < sVar199; local_b94 = local_b94 + 1) {
      pNVar194 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::operator[]
                           (&(pRVar188->handlerBlocks).
                             super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>,
                            (ulong)local_b94);
      sVar2 = (pNVar194->super_IString).str;
      pNVar194 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::operator[]
                           (&(pRVar189->handlerBlocks).
                             super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>,
                            (ulong)local_b94);
      bVar4 = compareNames(wasm::Name,wasm::Name_
                        (this,(Name)sVar2,(Name)(pNVar194->super_IString).str);
      if (!bVar4) {
        return false;
      }
    }
    sVar199 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::size
                        (&(pRVar188->handlerTags).
                          super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>);
    sVar200 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::size
                        (&(pRVar189->handlerTags).
                          super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>);
    if (sVar199 != sVar200) {
      return false;
    }
    for (castLeft_93._4_4_ = 0;
        sVar199 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::size
                            (&(pRVar188->handlerTags).
                              super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>),
        castLeft_93._4_4_ < sVar199; castLeft_93._4_4_ = castLeft_93._4_4_ + 1) {
      pIVar195 = &ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::operator[]
                            (&(pRVar188->handlerTags).
                              super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>,
                             (ulong)castLeft_93._4_4_)->super_IString;
      pIVar196 = &ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::operator[]
                            (&(pRVar189->handlerTags).
                              super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>,
                             (ulong)castLeft_93._4_4_)->super_IString;
      bVar4 = IString::operator!=(pIVar195,pIVar196);
      if (bVar4) {
        return false;
      }
    }
    break;
  case ResumeThrowId:
    pRVar190 = Expression::cast<wasm::ResumeThrow>(left);
    pRVar191 = Expression::cast<wasm::ResumeThrow>(right);
    sVar199 = ArenaVectorBase<ArenaVector<wasm::Type>,_wasm::Type>::size
                        (&(pRVar190->sentTypes).
                          super_ArenaVectorBase<ArenaVector<wasm::Type>,_wasm::Type>);
    sVar200 = ArenaVectorBase<ArenaVector<wasm::Type>,_wasm::Type>::size
                        (&(pRVar191->sentTypes).
                          super_ArenaVectorBase<ArenaVector<wasm::Type>,_wasm::Type>);
    if (sVar199 != sVar200) {
      return false;
    }
    for (__range4_24._4_4_ = 0;
        sVar199 = ArenaVectorBase<ArenaVector<wasm::Type>,_wasm::Type>::size
                            (&(pRVar190->sentTypes).
                              super_ArenaVectorBase<ArenaVector<wasm::Type>,_wasm::Type>),
        __range4_24._4_4_ < sVar199; __range4_24._4_4_ = __range4_24._4_4_ + 1) {
      pTVar192 = ArenaVectorBase<ArenaVector<wasm::Type>,_wasm::Type>::operator[]
                           (&(pRVar190->sentTypes).
                             super_ArenaVectorBase<ArenaVector<wasm::Type>,_wasm::Type>,
                            (ulong)__range4_24._4_4_);
      pTVar193 = ArenaVectorBase<ArenaVector<wasm::Type>,_wasm::Type>::operator[]
                           (&(pRVar191->sentTypes).
                             super_ArenaVectorBase<ArenaVector<wasm::Type>,_wasm::Type>,
                            (ulong)__range4_24._4_4_);
      bVar4 = wasm::Type::operator!=(pTVar192,pTVar193);
      if (bVar4) {
        return false;
      }
    }
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pRVar190->cont);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pRVar191->cont);
    sVar199 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                        (&(pRVar190->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                        );
    sVar200 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                        (&(pRVar191->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                        );
    if (sVar199 != sVar200) {
      return false;
    }
    join_0x00000010_0x00000000_ =
         ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::begin
                   (&(pRVar190->operands).
                     super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>);
    _child_24 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::end
                          (&(pRVar190->operands).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          );
    while (bVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                   operator!=((Iterator *)&__end4_24.index,(Iterator *)&child_24), bVar4) {
      ppEVar201 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                  operator*((Iterator *)&__end4_24.index);
      __range4_25 = (ExpressionList *)*ppEVar201;
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                 ((long)this + 0x30),(value_type *)&__range4_25);
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::operator++
                ((Iterator *)&__end4_24.index);
    }
    join_0x00000010_0x00000000_ =
         ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::begin
                   (&(pRVar191->operands).
                     super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>);
    _child_25 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::end
                          (&(pRVar191->operands).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          );
    while (bVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                   operator!=((Iterator *)&__end4_25.index,(Iterator *)&child_25), bVar4) {
      ppEVar201 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                  operator*((Iterator *)&__end4_25.index);
      pEStack_c38 = *ppEVar201;
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                 ((long)this + 0x48),&stack0xfffffffffffff3c8);
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::operator++
                ((Iterator *)&__end4_25.index);
    }
    sVar199 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::size
                        (&(pRVar190->handlerBlocks).
                          super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>);
    sVar200 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::size
                        (&(pRVar191->handlerBlocks).
                          super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>);
    if (sVar199 != sVar200) {
      return false;
    }
    for (local_c3c = 0;
        sVar199 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::size
                            (&(pRVar190->handlerBlocks).
                              super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>),
        local_c3c < sVar199; local_c3c = local_c3c + 1) {
      pNVar194 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::operator[]
                           (&(pRVar190->handlerBlocks).
                             super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>,
                            (ulong)local_c3c);
      sVar2 = (pNVar194->super_IString).str;
      pNVar194 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::operator[]
                           (&(pRVar191->handlerBlocks).
                             super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>,
                            (ulong)local_c3c);
      bVar4 = compareNames(wasm::Name,wasm::Name_
                        (this,(Name)sVar2,(Name)(pNVar194->super_IString).str);
      if (!bVar4) {
        return false;
      }
    }
    sVar199 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::size
                        (&(pRVar190->handlerTags).
                          super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>);
    sVar200 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::size
                        (&(pRVar191->handlerTags).
                          super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>);
    if (sVar199 != sVar200) {
      return false;
    }
    for (castLeft_94._4_4_ = 0;
        sVar199 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::size
                            (&(pRVar190->handlerTags).
                              super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>),
        castLeft_94._4_4_ < sVar199; castLeft_94._4_4_ = castLeft_94._4_4_ + 1) {
      pIVar195 = &ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::operator[]
                            (&(pRVar190->handlerTags).
                              super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>,
                             (ulong)castLeft_94._4_4_)->super_IString;
      pIVar196 = &ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::operator[]
                            (&(pRVar191->handlerTags).
                              super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>,
                             (ulong)castLeft_94._4_4_)->super_IString;
      bVar4 = IString::operator!=(pIVar195,pIVar196);
      if (bVar4) {
        return false;
      }
    }
    bVar4 = IString::operator!=(&(pRVar190->tag).super_IString,&(pRVar191->tag).super_IString);
    if (bVar4) {
      return false;
    }
    break;
  case StackSwitchId:
    pSVar197 = Expression::cast<wasm::StackSwitch>(left);
    pSVar198 = Expression::cast<wasm::StackSwitch>(right);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pSVar197->cont);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pSVar198->cont);
    sVar199 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                        (&(pSVar197->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                        );
    sVar200 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                        (&(pSVar198->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                        );
    if (sVar199 != sVar200) {
      return false;
    }
    join_0x00000010_0x00000000_ =
         ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::begin
                   (&(pSVar197->operands).
                     super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>);
    _child_26 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::end
                          (&(pSVar197->operands).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          );
    while (bVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                   operator!=((Iterator *)&__end4_26.index,(Iterator *)&child_26), bVar4) {
      ppEVar201 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                  operator*((Iterator *)&__end4_26.index);
      __range4_27 = (ExpressionList *)*ppEVar201;
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                 ((long)this + 0x30),(value_type *)&__range4_27);
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::operator++
                ((Iterator *)&__end4_26.index);
    }
    join_0x00000010_0x00000000_ =
         ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::begin
                   (&(pSVar198->operands).
                     super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>);
    _child_27 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::end
                          (&(pSVar198->operands).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          );
    while (bVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                   operator!=((Iterator *)&__end4_27.index,(Iterator *)&child_27), bVar4) {
      ppEVar201 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                  operator*((Iterator *)&__end4_27.index);
      local_cd8 = *ppEVar201;
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                 ((long)this + 0x48),&local_cd8);
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::operator++
                ((Iterator *)&__end4_27.index);
    }
    bVar4 = IString::operator!=(&(pSVar197->tag).super_IString,&(pSVar198->tag).super_IString);
    if (bVar4) {
      return false;
    }
  }
  return true;
}

Assistant:

bool compareNodes(Expression* left, Expression* right) {
      if (left->_id != right->_id) {
        return false;
      }

#define DELEGATE_ID left->_id

// Create cast versions of it for later operations.
#define DELEGATE_START(id)                                                     \
  [[maybe_unused]] auto* castLeft = left->cast<id>();                          \
  [[maybe_unused]] auto* castRight = right->cast<id>();

// Handle each type of field, comparing it appropriately.
#define DELEGATE_FIELD_CHILD(id, field)                                        \
  leftStack.push_back(castLeft->field);                                        \
  rightStack.push_back(castRight->field);

#define DELEGATE_FIELD_CHILD_VECTOR(id, field)                                 \
  if (castLeft->field.size() != castRight->field.size()) {                     \
    return false;                                                              \
  }                                                                            \
  for (auto* child : castLeft->field) {                                        \
    leftStack.push_back(child);                                                \
  }                                                                            \
  for (auto* child : castRight->field) {                                       \
    rightStack.push_back(child);                                               \
  }

#define COMPARE_FIELD(field)                                                   \
  if (castLeft->field != castRight->field) {                                   \
    return false;                                                              \
  }

#define DELEGATE_FIELD_INT(id, field) COMPARE_FIELD(field)
#define DELEGATE_FIELD_LITERAL(id, field) COMPARE_FIELD(field)
#define DELEGATE_FIELD_NAME(id, field) COMPARE_FIELD(field)
#define DELEGATE_FIELD_TYPE(id, field) COMPARE_FIELD(field)
#define DELEGATE_FIELD_HEAPTYPE(id, field) COMPARE_FIELD(field)
#define DELEGATE_FIELD_ADDRESS(id, field) COMPARE_FIELD(field)

#define COMPARE_LIST(field)                                                    \
  if (castLeft->field.size() != castRight->field.size()) {                     \
    return false;                                                              \
  }                                                                            \
  for (Index i = 0; i < castLeft->field.size(); i++) {                         \
    if (castLeft->field[i] != castRight->field[i]) {                           \
      return false;                                                            \
    }                                                                          \
  }

#define DELEGATE_FIELD_INT_ARRAY(id, field) COMPARE_LIST(field)
#define DELEGATE_FIELD_INT_VECTOR(id, field) COMPARE_LIST(field)
#define DELEGATE_FIELD_NAME_VECTOR(id, field) COMPARE_LIST(field)
#define DELEGATE_FIELD_TYPE_VECTOR(id, field) COMPARE_LIST(field)

#define DELEGATE_FIELD_SCOPE_NAME_DEF(id, field)                               \
  if (castLeft->field.is() != castRight->field.is()) {                         \
    return false;                                                              \
  }                                                                            \
  rightNames[castLeft->field] = castRight->field;

#define DELEGATE_FIELD_SCOPE_NAME_USE(id, field)                               \
  if (!compareNames(castLeft->field, castRight->field)) {                      \
    return false;                                                              \
  }

#define DELEGATE_FIELD_SCOPE_NAME_USE_VECTOR(id, field)                        \
  if (castLeft->field.size() != castRight->field.size()) {                     \
    return false;                                                              \
  }                                                                            \
  for (Index i = 0; i < castLeft->field.size(); i++) {                         \
    if (!compareNames(castLeft->field[i], castRight->field[i])) {              \
      return false;                                                            \
    }                                                                          \
  }

#include "wasm-delegations-fields.def"

      return true;
    }